

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::CloseUpvalue(void **upvalueList,void *variable,int offset,int size)

{
  void *pvVar1;
  Upvalue *pUVar2;
  bool bVar3;
  char *copy;
  Upvalue *next;
  Upvalue *upvalue;
  int size_local;
  int offset_local;
  void *variable_local;
  void **upvalueList_local;
  
  if ((upvalueList == (void **)0x0) || (variable == (void *)0x0)) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    next = (Upvalue *)anon_unknown.dwarf_127724::ReadVmMemoryPointer(upvalueList);
    while( true ) {
      bVar3 = false;
      if (next != (Upvalue *)0x0) {
        pvVar1 = anon_unknown.dwarf_127724::ReadVmMemoryPointer(next);
        bVar3 = pvVar1 == variable;
      }
      if (!bVar3) break;
      pUVar2 = (Upvalue *)anon_unknown.dwarf_127724::ReadVmMemoryPointer(&next->next);
      pvVar1 = (void *)((long)&next->target + (long)offset);
      memcpy(pvVar1,variable,(ulong)(uint)size);
      anon_unknown.dwarf_127724::WriteVmMemoryPointer(next,pvVar1);
      anon_unknown.dwarf_127724::WriteVmMemoryPointer(&next->next,(void *)0x0);
      next = pUVar2;
    }
    anon_unknown.dwarf_127724::WriteVmMemoryPointer(upvalueList,next);
  }
  return;
}

Assistant:

void NULLC::CloseUpvalue(void **upvalueList, void *variable, int offset, int size)
{
	if (!upvalueList || !variable)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}

	struct Upvalue
	{
		void *target;
		Upvalue *next;
	};

	Upvalue *upvalue = (Upvalue*)ReadVmMemoryPointer(upvalueList);

	while (upvalue && ReadVmMemoryPointer(&upvalue->target) == variable)
	{
		Upvalue *next = (Upvalue*)ReadVmMemoryPointer(&upvalue->next);

		char *copy = (char*)upvalue + offset;
		memcpy(copy, variable, unsigned(size));
		WriteVmMemoryPointer(&upvalue->target, copy);
		WriteVmMemoryPointer(&upvalue->next, NULL);

		upvalue = next;
	}

	WriteVmMemoryPointer(upvalueList, upvalue);
}